

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O2

void Gia_ManPrintChains(Gia_Man_t *p,Vec_Int_t *vFadds,Vec_Int_t *vMap,Vec_Wec_t *vChains)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  int i;
  uint uVar4;
  uint i_00;
  
  i_00 = 0;
  uVar4 = 0;
  do {
    if (vChains->nSize <= (int)i_00) {
      printf("Total chains = %d. Total full-adders = %d.\n",(ulong)(uint)vChains->nSize,(ulong)uVar4
            );
      return;
    }
    p_00 = Vec_WecEntry(vChains,i_00);
    iVar1 = p_00->nSize;
    if (i_00 < 10) {
      i = 0;
      printf("Chain %4d : %4d    ",(ulong)i_00);
      do {
        if (p_00->nSize <= i) goto LAB_004e114b;
        uVar2 = Vec_IntEntry(p_00,i);
        uVar3 = Vec_IntEntry(vFadds,uVar2 * 5 + 4);
        printf("%d(%d) ",(ulong)uVar2,(ulong)uVar3);
        if (i != p_00->nSize + -1) {
          printf("-> ");
        }
        i = i + 1;
      } while (i != 8);
      printf("...");
LAB_004e114b:
      putchar(10);
    }
    else if (i_00 == 10) {
      puts("...");
    }
    uVar4 = uVar4 + iVar1;
    i_00 = i_00 + 1;
  } while( true );
}

Assistant:

void Gia_ManPrintChains( Gia_Man_t * p, Vec_Int_t * vFadds, Vec_Int_t * vMap, Vec_Wec_t * vChains )
{
    Vec_Int_t * vChain;
    int i, k, iFadd, Count = 0;
    Vec_WecForEachLevel( vChains, vChain, i )
    {
        Count += Vec_IntSize(vChain);
        if ( i < 10 )
        {
            printf( "Chain %4d : %4d    ", i, Vec_IntSize(vChain) );
            Vec_IntForEachEntry( vChain, iFadd, k )
            {
                printf( "%d(%d) ", iFadd, Vec_IntEntry(vFadds, 5*iFadd+4) );
                if ( k != Vec_IntSize(vChain) - 1 )
                    printf( "-> " );
                if ( k > 6 )
                {
                    printf( "..." );
                    break;
                }
            }
            printf( "\n" );
        }
        else if ( i == 10 )
            printf( "...\n" );

    }
    printf( "Total chains = %d. Total full-adders = %d.\n", Vec_WecSize(vChains), Count );
}